

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feasibility_bounded.hpp
# Opt level: O0

void computeStartingPointBounded
               (Instance *instance,Settings *settings,Statistics *stats,QpModelStatus *modelstatus,
               QpHotstartInformation *result,HighsTimer *timer)

{
  reference pvVar1;
  reference pvVar2;
  undefined4 *in_RCX;
  long in_RSI;
  size_type sVar3;
  long in_RDI;
  double dVar4;
  double dVar5;
  int i_1;
  vector<BasisStatus,_std::allocator<BasisStatus>_> atlower;
  vector<int,_std::allocator<int>_> initialinactive;
  vector<int,_std::allocator<int>_> initialactive;
  QpVector ra;
  QpVector x0;
  HighsInt j_1;
  double sum_1;
  HighsInt i;
  HighsInt j;
  HighsInt r;
  QpVector res;
  size_t k_1;
  size_t k;
  size_t row;
  double sum;
  size_t idx;
  size_t col;
  vector<double,_std::allocator<double>_> L;
  QpVector *in_stack_fffffffffffffd98;
  QpVector *in_stack_fffffffffffffda0;
  vector<BasisStatus,_std::allocator<BasisStatus>_> *in_stack_fffffffffffffdb0;
  size_type in_stack_fffffffffffffdb8;
  value_type vVar6;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  HighsInt d;
  QpVector *in_stack_fffffffffffffdd0;
  QpVector *in_stack_fffffffffffffdd8;
  vector<BasisStatus,_std::allocator<BasisStatus>_> *in_stack_fffffffffffffe38;
  vector<BasisStatus,_std::allocator<BasisStatus>_> *this;
  int local_19c;
  vector<int,_std::allocator<int>_> local_168 [3];
  int local_118;
  vector<int,_std::allocator<int>_> vStack_110;
  vector<double,_std::allocator<double>_> vStack_f8;
  int local_dc;
  double local_d8;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_bc;
  vector<double,_std::allocator<double>_> local_a0;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  double local_70;
  vector<BasisStatus,_std::allocator<BasisStatus>_> *local_68;
  ulong local_60;
  vector<BasisStatus,_std::allocator<BasisStatus>_> local_48;
  undefined4 *local_20;
  long local_10;
  long local_8;
  
  this = &local_48;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x7515bc);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  for (local_60 = 0; local_60 < (ulong)(long)*(int *)(local_8 + 4); local_60 = local_60 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_8 + 0xb0),local_60);
    local_68 = (vector<BasisStatus,_std::allocator<BasisStatus>_> *)(long)*pvVar1;
    while (in_stack_fffffffffffffe38 = local_68,
          pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_8 + 0xb0),local_60 + 1),
          in_stack_fffffffffffffe38 <
          (vector<BasisStatus,_std::allocator<BasisStatus>_> *)(long)*pvVar1) {
      local_70 = 0.0;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_8 + 200),(size_type)local_68);
      local_78 = (ulong)*pvVar1;
      if (local_78 == local_60) {
        for (local_80 = 0; local_80 < local_78; local_80 = local_80 + 1) {
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&local_48,
                              local_80 * (long)*(int *)(local_8 + 4) + local_78);
          dVar4 = *pvVar2;
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&local_48,
                              local_80 * (long)*(int *)(local_8 + 4) + local_78);
          local_70 = dVar4 * *pvVar2 + local_70;
        }
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_8 + 0xe0),
                            (size_type)local_68);
        dVar4 = sqrt(*pvVar2 - local_70);
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&local_48,
                            local_78 * (long)*(int *)(local_8 + 4) + local_78);
        *pvVar2 = dVar4;
      }
      else {
        for (local_88 = 0; local_88 < local_78; local_88 = local_88 + 1) {
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&local_48,
                              local_88 * (long)*(int *)(local_8 + 4) + local_60);
          dVar4 = *pvVar2;
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&local_48,
                              local_88 * (long)*(int *)(local_8 + 4) + local_78);
          local_70 = dVar4 * *pvVar2 + local_70;
        }
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_8 + 0xe0),
                            (size_type)local_68);
        dVar5 = *pvVar2 - local_70;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&local_48,
                            local_78 * (long)*(int *)(local_8 + 4) + local_78);
        dVar4 = *pvVar2;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&local_48,
                            local_78 * (long)*(int *)(local_8 + 4) + local_60);
        *pvVar2 = dVar5 / dVar4;
      }
      local_68 = (vector<BasisStatus,_std::allocator<BasisStatus>_> *)
                 ((long)&(local_68->super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>).
                         _M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  QpVector::operator-(in_stack_fffffffffffffdd8);
  for (local_c4 = 0; local_cc = local_bc, local_c4 < local_bc; local_c4 = local_c4 + 1) {
    for (local_c8 = 0; local_c8 < local_c4; local_c8 = local_c8 + 1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_a0,(long)local_c8);
      dVar4 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&local_48,
                          (long)(local_c8 * *(int *)(local_8 + 4) + local_c4));
      dVar5 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_a0,(long)local_c4);
      *pvVar2 = -dVar4 * dVar5 + *pvVar2;
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&local_48,
                        (long)(local_c4 * *(int *)(local_8 + 4) + local_c4));
    dVar4 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_a0,(long)local_c4);
    *pvVar2 = *pvVar2 / dVar4;
  }
  while( true ) {
    d = (HighsInt)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
    local_cc = local_cc + -1;
    if (local_cc < 0) break;
    local_d8 = 0.0;
    local_dc = local_bc;
    while (local_dc = local_dc + -1, local_cc < local_dc) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_a0,(long)local_dc);
      dVar4 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&local_48,
                          (long)(local_cc * *(int *)(local_8 + 4) + local_dc));
      local_d8 = dVar4 * *pvVar2 + local_d8;
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_a0,(long)local_cc);
    dVar5 = *pvVar2 - local_d8;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&local_48,
                        (long)(local_cc * *(int *)(local_8 + 4) + local_cc));
    dVar4 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_a0,(long)local_cc);
    *pvVar2 = dVar5 / dVar4;
  }
  QpVector::QpVector(in_stack_fffffffffffffdd0,d);
  QpVector::QpVector(in_stack_fffffffffffffdd0,d);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x751d12);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x751d1f);
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::vector
            ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)0x751d2c);
  local_19c = 0;
  do {
    if (*(int *)(local_8 + 4) <= local_19c) {
      sVar3 = std::vector<int,_std::allocator<int>_>::size(local_168);
      if (sVar3 == 0) {
        *local_20 = 2;
      }
      std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator=
                (this,in_stack_fffffffffffffe38);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)this,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe38);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)this,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe38);
      QpVector::operator=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      QpVector::operator=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
LAB_007522da:
      std::vector<BasisStatus,_std::allocator<BasisStatus>_>::~vector(in_stack_fffffffffffffdb0);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0);
      QpVector::~QpVector(in_stack_fffffffffffffda0);
      QpVector::~QpVector(in_stack_fffffffffffffda0);
      QpVector::~QpVector(in_stack_fffffffffffffda0);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdb0);
      return;
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_a0,(long)local_19c);
    if (0.5 / *(double *)(local_10 + 0x50) < *pvVar2) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_8 + 0x1e8),
                          (long)local_19c);
      vVar6 = *pvVar2;
      dVar4 = std::numeric_limits<double>::infinity();
      if (((vVar6 == dVar4) && (!NAN(vVar6) && !NAN(dVar4))) &&
         (pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_8 + 0x38),
                              (long)local_19c), *pvVar2 <= 0.0 && *pvVar2 != 0.0)) {
        *local_20 = 3;
        goto LAB_007522da;
      }
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_a0,(long)local_19c);
    if (*pvVar2 < 0.5 / *(double *)(local_10 + 0x50)) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_8 + 0x1d0),
                          (long)local_19c);
      vVar6 = *pvVar2;
      dVar4 = std::numeric_limits<double>::infinity();
      if (((vVar6 == dVar4) && (!NAN(vVar6) && !NAN(dVar4))) &&
         (pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_8 + 0x38),
                              (long)local_19c), 0.0 < *pvVar2)) {
        *local_20 = 3;
        goto LAB_007522da;
      }
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_a0,(long)local_19c);
    vVar6 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_8 + 0x1d0),(long)local_19c
                       );
    if (*pvVar2 < vVar6) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_a0,(long)local_19c);
      vVar6 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_8 + 0x1e8),
                          (long)local_19c);
      if (vVar6 < *pvVar2) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda0,
                   &in_stack_fffffffffffffd98->num_nz);
      }
      else {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_8 + 0x1e8),
                            (long)local_19c);
        in_stack_fffffffffffffdb0 = (vector<BasisStatus,_std::allocator<BasisStatus>_> *)*pvVar2;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_a0,(long)local_19c)
        ;
        *pvVar2 = (value_type)in_stack_fffffffffffffdb0;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda0,
                   &in_stack_fffffffffffffd98->num_nz);
        std::vector<BasisStatus,_std::allocator<BasisStatus>_>::push_back
                  ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)in_stack_fffffffffffffda0,
                   (value_type *)in_stack_fffffffffffffd98);
      }
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_8 + 0x1d0),
                          (long)local_19c);
      vVar6 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_a0,(long)local_19c);
      *pvVar2 = vVar6;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda0,
                 &in_stack_fffffffffffffd98->num_nz);
      std::vector<BasisStatus,_std::allocator<BasisStatus>_>::push_back
                ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)in_stack_fffffffffffffda0,
                 (value_type *)in_stack_fffffffffffffd98);
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_a0,(long)local_19c);
    if (0.0001 < ABS(*pvVar2)) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_a0,(long)local_19c);
      in_stack_fffffffffffffda0 = (QpVector *)*pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&vStack_f8,(long)local_19c);
      *pvVar2 = (value_type)in_stack_fffffffffffffda0;
      sVar3 = (size_type)local_118;
      local_118 = local_118 + 1;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_110,sVar3);
      *pvVar1 = local_19c;
    }
    local_19c = local_19c + 1;
  } while( true );
}

Assistant:

static void computeStartingPointBounded(Instance& instance, Settings& settings,
                                        Statistics& stats,
                                        QpModelStatus& modelstatus,
                                        QpHotstartInformation& result,
                                        HighsTimer& timer) {
  // compute initial feasible point for problems with bounds only (no general
  // linear constraints)

  // compute  Qx + c = 0 --> x = Q^-1c
  std::vector<double> L;
  L.resize(instance.num_var * instance.num_var);

  // compute cholesky factorization of Q
  for (size_t col = 0; col < (size_t)instance.num_var; col++) {
    for (size_t idx = instance.Q.mat.start[col];
         idx < (size_t)instance.Q.mat.start[col + 1]; idx++) {
      double sum = 0;
      size_t row = instance.Q.mat.index[idx];
      if (row == col) {
        for (size_t k = 0; k < row; k++)
          sum += L[k * instance.num_var + row] * L[k * instance.num_var + row];
        L[row * instance.num_var + row] = sqrt(instance.Q.mat.value[idx] - sum);
      } else {
        for (size_t k = 0; k < row; k++)
          sum +=
              (L[k * instance.num_var + col] * L[k * instance.num_var + row]);
        L[row * instance.num_var + col] =
            (instance.Q.mat.value[idx] - sum) / L[row * instance.num_var + row];
      }
    }
  }

  // solve for c
  QpVector res = -instance.c;
  for (HighsInt r = 0; r < res.dim; r++) {
    for (HighsInt j = 0; j < r; j++) {
      res.value[r] -= res.value[j] * L[j * instance.num_var + r];
    }
    res.value[r] /= L[r * instance.num_var + r];
  }

  for (HighsInt i = res.dim - 1; i >= 0; i--) {
    double sum = 0.0;
    for (HighsInt j = res.dim - 1; j > i; j--) {
      sum += res.value[j] * L[i * instance.num_var + j];
    }
    res.value[i] = (res.value[i] - sum) / L[i * instance.num_var + i];
  }

  // project solution to bounds and collect active bounds
  QpVector x0(instance.num_var);
  QpVector ra(instance.num_con);
  std::vector<HighsInt> initialactive;
  std::vector<HighsInt> initialinactive;
  std::vector<BasisStatus> atlower;

  for (int i = 0; i < instance.num_var; i++) {
    if (res.value[i] > 0.5 / settings.hessianregularizationfactor &&
        instance.var_up[i] == std::numeric_limits<double>::infinity() &&
        instance.c.value[i] < 0.0) {
      modelstatus = QpModelStatus::kUnbounded;
      return;
    } else if (res.value[i] < 0.5 / settings.hessianregularizationfactor &&
               instance.var_lo[i] == std::numeric_limits<double>::infinity() &&
               instance.c.value[i] > 0.0) {
      modelstatus = QpModelStatus::kUnbounded;
      return;
    } else if (res.value[i] <= instance.var_lo[i]) {
      res.value[i] = instance.var_lo[i];
      initialactive.push_back(i + instance.num_con);
      atlower.push_back(BasisStatus::kActiveAtLower);
    } else if (res.value[i] >= instance.var_up[i]) {
      res.value[i] = instance.var_up[i];
      initialactive.push_back(i + instance.num_con);
      atlower.push_back(BasisStatus::kActiveAtUpper);
    } else {
      initialinactive.push_back(i + instance.num_con);
    }
    if (fabs(res.value[i]) > 1e-4) {
      x0.value[i] = res.value[i];
      x0.index[x0.num_nz++] = i;
    }
  }

  // if no bounds are active, solution lies in the interior -> optimal
  if (initialactive.size() == 0) {
    modelstatus = QpModelStatus::kOptimal;
  }

  assert((HighsInt)(initialactive.size() + initialinactive.size()) ==
         instance.num_var);

  result.status = atlower;
  result.active = initialactive;
  result.inactive = initialinactive;
  result.primal = x0;
  result.rowact = ra;
}